

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

void BinaryCache::PutLexemes(char *path,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  void *__dest;
  int iVar2;
  uint *puVar3;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 == lastHash) {
    return;
  }
  if (DAT_0024bf64 != 0) {
    puVar3 = (uint *)(cache + 0x20);
    iVar2 = DAT_0024bf64;
    do {
      if (uVar1 == puVar3[-6]) {
        if (*(long *)(puVar3 + -2) == 0) {
          __dest = operator_new__((ulong)lexCount << 5);
          *(void **)(puVar3 + -2) = __dest;
          memcpy(__dest,lexStart,(ulong)lexCount << 5);
          *puVar3 = lexCount;
          return;
        }
        __assert_fail("!cache[i].lexemes",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0x88,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
      }
      puVar3 = puVar3 + 10;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  __assert_fail("!\"module not found\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                ,0x92,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
}

Assistant:

void BinaryCache::PutLexemes(const char* path, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	for(unsigned i = 0; i < cache.size(); i++)
	{
		BinaryCache::CodeDescriptor &desc = cache[i];

		if(hash == cache[i].nameHash)
		{
			assert(!cache[i].lexemes);

			desc.lexemes = new Lexeme[lexCount];
			memcpy(desc.lexemes, lexStart, lexCount * sizeof(Lexeme));
			desc.lexemeCount = lexCount;

			return;
		}
	}

	assert(!"module not found");
}